

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sig_pause.c
# Opt level: O0

void sig_pause(void)

{
  undefined1 local_88 [8];
  sigset_t ss;
  
  sigemptyset((sigset_t *)local_88);
  sigsuspend((sigset_t *)local_88);
  return;
}

Assistant:

void sig_pause(void)
{
#ifdef HASSIGPROCMASK
  sigset_t ss;
  sigemptyset(&ss);
  sigsuspend(&ss);
#else
  sigpause(0);
#endif
}